

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::BaseLineTestInstance::BaseLineTestInstance
          (BaseLineTestInstance *this,Context *context,VkPrimitiveTopology primitiveTopology,
          PrimitiveWideness wideness,VkSampleCountFlagBits sampleCount)

{
  VkPhysicalDeviceProperties *pVVar1;
  NotSupportedError *pNVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  value_type_conflict3 local_1c8;
  value_type_conflict3 local_1c4;
  MessageBuilder local_1c0;
  float *local_40;
  float *range;
  VkSampleCountFlagBits local_24;
  PrimitiveWideness local_20;
  VkSampleCountFlagBits sampleCount_local;
  PrimitiveWideness wideness_local;
  VkPrimitiveTopology primitiveTopology_local;
  Context *context_local;
  BaseLineTestInstance *this_local;
  
  local_24 = sampleCount;
  local_20 = wideness;
  sampleCount_local = primitiveTopology;
  _wideness_local = context;
  context_local = (Context *)this;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (&this->super_BaseRenderingTestInstance,context,sampleCount,0x100);
  (this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BaseLineTestInstance_016b26d8;
  this->m_iteration = 0;
  this->m_iterationCount = 3;
  this->m_primitiveTopology = sampleCount_local;
  this->m_primitiveWideness = local_20;
  this->m_allIterationsPassed = true;
  this->m_maxLineWidth = 1.0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_lineWidths);
  pVVar1 = Context::getDeviceProperties(_wideness_local);
  if ((pVVar1->limits).strictLines == 0) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Strict rasterization is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0x44c);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    range._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->m_lineWidths,(long)this->m_iterationCount,(value_type_conflict3 *)&range);
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    pVVar3 = Context::getDeviceFeatures
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    if (pVVar3->wideLines == 0) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x456);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pVVar1 = Context::getDeviceProperties(_wideness_local);
    local_40 = (pVVar1->limits).lineWidthRange;
    this_00 = Context::getTestContext
                        ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [29])"ALIASED_LINE_WIDTH_RANGE = [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_40);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x136aa81);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_40 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x131325b);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    if (local_40[1] <= 1.0) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x45e);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    local_1c4 = 5.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,&local_1c4);
    local_1c8 = 10.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,&local_1c8);
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,local_40 + 1);
    this->m_maxLineWidth = local_40[1];
  }
  return;
}

Assistant:

BaseLineTestInstance::BaseLineTestInstance (Context& context, VkPrimitiveTopology primitiveTopology, PrimitiveWideness wideness, VkSampleCountFlagBits sampleCount)
	: BaseRenderingTestInstance			(context, sampleCount)
	, m_iteration						(0)
	, m_iterationCount					(3)
	, m_primitiveTopology				(primitiveTopology)
	, m_primitiveWideness				(wideness)
	, m_allIterationsPassed				(true)
	, m_maxLineWidth					(1.0f)
{
	DE_ASSERT(m_primitiveWideness < PRIMITIVEWIDENESS_LAST);

	if (!context.getDeviceProperties().limits.strictLines)
		TCU_THROW(NotSupportedError, "Strict rasterization is not supported");

	// create line widths
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_lineWidths.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		if (!m_context.getDeviceFeatures().wideLines)
			TCU_THROW(NotSupportedError , "wide line support required");

		const float*	range = context.getDeviceProperties().limits.lineWidthRange;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			TCU_THROW(NotSupportedError, "wide line support required");

		// set hand picked sizes
		m_lineWidths.push_back(5.0f);
		m_lineWidths.push_back(10.0f);
		m_lineWidths.push_back(range[1]);
		DE_ASSERT((int)m_lineWidths.size() == m_iterationCount);

		m_maxLineWidth = range[1];
	}
	else
		DE_ASSERT(false);
}